

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O1

err_t stb99RiVal(stb99_seed *seed,size_t r)

{
  long lVar1;
  ulong uVar2;
  
  if (seed->ri[0] == r) {
    lVar1 = 0;
    do {
      uVar2 = seed->ri[lVar1 + 1];
      if (uVar2 < 0x11) {
        uVar2 = lVar1 + 1;
        goto LAB_001433fb;
      }
      if (0x3333333333333332 < uVar2) {
        return 0x20c;
      }
      if (uVar2 * 2 < seed->ri[lVar1]) {
        return 0x20c;
      }
      if (seed->ri[lVar1] * 4 - 0x10 <= uVar2 * 5) {
        return 0x20c;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
    uVar2 = 10;
LAB_001433fb:
    if (seed->ri[uVar2 - 1] < 0x21) {
      if (uVar2 < 10) {
        do {
          if (seed->ri[uVar2] != 0) {
            return 0x20c;
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != 10);
      }
      return 0;
    }
  }
  return 0x20c;
}

Assistant:

static err_t stb99RiVal(const stb99_seed* seed, size_t r)
{
	size_t i;
	// проверить ri[0]
	if (seed->ri[0] != r)
		return ERR_BAD_SEED;
	ASSERT(seed->ri[0] > 16);
	// проверить цепочку ri
	for (i = 1; i < COUNT_OF(seed->ri) && seed->ri[i] > 16; ++i)
		if (seed->ri[i] >= SIZE_MAX / 5 ||
			seed->ri[i - 1] > 2 * seed->ri[i] ||
			5 * seed->ri[i] >= 4 * seed->ri[i - 1] - 16)
			return ERR_BAD_SEED;
	if (seed->ri[i - 1] > 32)
		return ERR_BAD_SEED;
	for (; i < COUNT_OF(seed->ri); ++i)
		if (seed->ri[i] != 0)
			return ERR_BAD_SEED;
	// все хорошо
	return ERR_OK;
}